

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeSetMaxOrd(void *cvode_mem,int maxord)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0xa3;
  }
  else if (maxord < 1) {
    msgfmt = "maxord <= 0 illegal.";
    iVar1 = -0x16;
    error_code = -0x16;
    line = 0xab;
  }
  else {
    if (maxord <= *(int *)((long)cvode_mem + 0x460)) {
      *(int *)((long)cvode_mem + 0x2c8) = maxord;
      return 0;
    }
    msgfmt = "Illegal attempt to increase maximum method order.";
    iVar1 = -0x16;
    error_code = -0x16;
    line = 0xb6;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSetMaxOrd",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeSetMaxOrd(void* cvode_mem, int maxord)
{
  CVodeMem cv_mem;
  int qmax_alloc;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (maxord <= 0)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NEG_MAXORD);
    return (CV_ILL_INPUT);
  }

  /* Cannot increase maximum order beyond the value that
     was used when allocating memory */
  qmax_alloc = cv_mem->cv_qmax_alloc;

  if (maxord > qmax_alloc)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_MAXORD);
    return (CV_ILL_INPUT);
  }

  cv_mem->cv_qmax = maxord;

  return (CV_SUCCESS);
}